

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O2

void __thiscall
flatbuffers::BaseBfbsGenerator::ForAllFields
          (BaseBfbsGenerator *this,Object *object,bool reverse,
          function<void_(const_reflection::Field_*)> *func)

{
  uint16_t uVar1;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar2;
  return_type pFVar3;
  ulong uVar4;
  uint32_t i;
  uint i_00;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar2 = reflection::Object::fields(object);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,(ulong)*(uint *)pVVar2
            );
  i_00 = 0;
  while( true ) {
    pVVar2 = reflection::Object::fields(object);
    if (*(uint *)pVVar2 <= i_00) break;
    pVVar2 = reflection::Object::fields(object);
    pFVar3 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(pVVar2,i_00);
    uVar1 = reflection::Field::id(pFVar3);
    local_38._M_impl.super__Vector_impl_data._M_start[uVar1] = i_00;
    i_00 = i_00 + 1;
  }
  for (uVar5 = 0;
      uVar5 < (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar5 = uVar5 + 1) {
    pVVar2 = reflection::Object::fields(object);
    uVar4 = uVar5;
    if (reverse) {
      uVar4 = ~uVar5 + ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2);
    }
    pFVar3 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                       (pVVar2,local_38._M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::function<void_(const_reflection::Field_*)>::operator()(func,pFVar3);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                    std::function<void(const reflection::Field *)> func) const {
    const std::vector<uint32_t> field_to_id_map = FieldIdToIndex(object);
    for (size_t i = 0; i < field_to_id_map.size(); ++i) {
      func(object->fields()->Get(
          field_to_id_map[reverse ? field_to_id_map.size() - (i + 1) : i]));
    }
  }